

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

QP2PassNodeResult __thiscall mp::QP2PassVisitor::DoVisitPow2(QP2PassVisitor *this,Expr expr)

{
  bool bVar1;
  QP2PassNodeResult QVar2;
  long in_RDI;
  longdouble lVar3;
  double dVar4;
  pair<bool,_double> pVar5;
  int degL;
  AffineExpr aeL;
  pair<bool,_double> isc;
  AffineExpr *in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed2;
  undefined2 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffeda;
  undefined1 in_stack_fffffffffffffedb;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar6;
  undefined6 in_stack_fffffffffffffee0;
  undefined6 uVar7;
  undefined2 in_stack_fffffffffffffee6;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined6 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefe;
  ExprBase in_stack_ffffffffffffff00;
  AlgebraicExpression<mp::LinTerms> local_b0;
  undefined1 local_28;
  double local_20;
  int local_4;
  
  pVar5 = IsConst((QP2PassVisitor *)CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),
                  (Expr)in_stack_ffffffffffffff00.impl_);
  local_20 = pVar5.second;
  local_28 = pVar5.first;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
              ((AlgebraicExpression<mp::LinTerms> *)
               CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0));
    QVar2 = VisitAtmostAffine((QP2PassVisitor *)
                              CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),
                              (Expr)in_stack_ffffffffffffff00.impl_,
                              (AffineExpr *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (*(int *)(in_RDI + 0x14) < QVar2 * 2) {
      local_4 = 1000;
    }
    else if (QVar2 == 0) {
      uVar6 = (undefined4)*(unkbyte10 *)(in_RDI + 0x20);
      uVar7 = (undefined6)((unkuint10)*(unkbyte10 *)(in_RDI + 0x20) >> 0x20);
      dVar4 = AlgebraicExpression<mp::LinTerms>::constant_term(&local_b0);
      lVar3 = (longdouble)dVar4 * (longdouble)CONCAT64(uVar7,uVar6);
      uVar6 = SUB104(lVar3,0);
      uVar7 = (undefined6)((unkuint10)lVar3 >> 0x20);
      dVar4 = AlgebraicExpression<mp::LinTerms>::constant_term(&local_b0);
      DoAddConst((QP2PassVisitor *)CONCAT26(in_stack_fffffffffffffee6,uVar7),
                 (longdouble)
                 CONCAT28(in_stack_fffffffffffffed8,
                          CONCAT62(in_stack_fffffffffffffed2,
                                   (short)((unkuint10)
                                           ((longdouble)dVar4 * (longdouble)CONCAT64(uVar7,uVar6))
                                          >> 0x40))));
      local_4 = 0;
    }
    else {
      bVar1 = ProcessAffineFactors
                        ((QP2PassVisitor *)
                         CONCAT44(in_stack_fffffffffffffedc,
                                  CONCAT13(in_stack_fffffffffffffedb,
                                           CONCAT12(in_stack_fffffffffffffeda,
                                                    in_stack_fffffffffffffed8))),
                         (AffineExpr *)CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0)
                         ,in_stack_fffffffffffffec8);
      if (bVar1) {
        local_4 = QVar2 << 1;
      }
      else {
        local_4 = 1000;
      }
    }
    AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
              ((AlgebraicExpression<mp::LinTerms> *)0x5080c0);
  }
  else {
    DoAddConst((QP2PassVisitor *)CONCAT26(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0),
               (longdouble)
               CONCAT28(in_stack_fffffffffffffed8,
                        CONCAT62(in_stack_fffffffffffffed2,
                                 (short)((unkuint10)
                                         ((longdouble)local_20 *
                                         *(longdouble *)(in_RDI + 0x20) * (longdouble)local_20) >>
                                        0x40))));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::DoVisitPow2(
    Expr expr) {
  auto isc = IsConst(expr);
  if (isc.first) {
    DoAddConst(factor_ * isc.second * isc.second);
    return 0;
  }
  AffineExpr aeL;
  int degL = VisitAtmostAffine(expr, aeL);
  if (degL*2 > mode_)
    return 1000;               // abort top-level term
  if (!degL) {                 // can happen
    DoAddConst(factor_
               * aeL.constant_term() * aeL.constant_term());
    return 0;
  }
  if (!ProcessAffineFactors(aeL, aeL))
    return 1000;
  return degL*2;
}